

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEObservation.cpp
# Opt level: O0

bool __thiscall test_CEObservation::test_constructor(test_CEObservation *this)

{
  CEBody *pCVar1;
  CEDate *pCVar2;
  CEObserver *pCVar3;
  CEBody *pCVar4;
  CEDate *pCVar5;
  CEObserver *pCVar6;
  long *in_RDI;
  byte bVar7;
  byte bVar8;
  CEObservation test4;
  CEObservation test3;
  CEObservation test2;
  CEObservation test1;
  undefined6 in_stack_fffffffffffffb00;
  CEObservation *in_stack_fffffffffffffb10;
  undefined7 in_stack_fffffffffffffb18;
  undefined1 in_stack_fffffffffffffb1f;
  CEObservation *in_stack_fffffffffffffb20;
  allocator *paVar9;
  CEObserver *in_stack_fffffffffffffb28;
  undefined7 in_stack_fffffffffffffb30;
  undefined1 in_stack_fffffffffffffb37;
  undefined4 local_3b8;
  allocator local_3b1;
  string local_3b0 [32];
  undefined4 local_390;
  allocator local_389;
  string local_388 [32];
  undefined4 local_368;
  allocator local_361;
  string local_360 [32];
  CEObservation local_340;
  undefined4 local_2d0;
  allocator local_2c9;
  string local_2c8 [32];
  undefined4 local_2a8;
  allocator local_2a1;
  string local_2a0 [32];
  undefined4 local_280;
  allocator local_279;
  string local_278 [32];
  CEObservation local_258;
  undefined4 local_1e8;
  allocator local_1e1;
  string local_1e0 [32];
  undefined4 local_1c0;
  allocator local_1b9;
  string local_1b8 [32];
  undefined4 local_198;
  allocator local_191;
  string local_190 [32];
  CEObservation local_170;
  undefined4 local_100;
  allocator local_f9;
  string local_f8 [32];
  undefined4 local_d8;
  allocator local_d1;
  string local_d0 [32];
  undefined4 local_b0;
  allocator local_a9;
  string local_a8 [48];
  CEObservation local_78;
  
  CEObservation::CEObservation(in_stack_fffffffffffffb10);
  pCVar1 = CEObservation::Body(&local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"test_constructor",&local_a9);
  local_b0 = 0x5b;
  (**(code **)(*in_RDI + 0x48))(in_RDI,pCVar1 == (CEBody *)0x0,local_a8,&local_b0);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  pCVar2 = CEObservation::Date(&local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"test_constructor",&local_d1);
  local_d8 = 0x5c;
  (**(code **)(*in_RDI + 0x48))(in_RDI,pCVar2 == (CEDate *)0x0,local_d0,&local_d8);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  pCVar3 = CEObservation::Observer(&local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"test_constructor",&local_f9);
  local_100 = 0x5d;
  (**(code **)(*in_RDI + 0x48))(in_RDI,pCVar3 == (CEObserver *)0x0,local_f8,&local_100);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  CEObservation::CEObservation
            (in_stack_fffffffffffffb20,
             (CEObservation *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18));
  pCVar1 = CEObservation::Body(&local_170);
  pCVar4 = CEObservation::Body((CEObservation *)(in_RDI + 0x6c));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"test_constructor",&local_191);
  local_198 = 0x61;
  (**(code **)(*in_RDI + 0x48))(in_RDI,pCVar1 == pCVar4,local_190,&local_198);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  pCVar2 = CEObservation::Date(&local_170);
  pCVar5 = CEObservation::Date((CEObservation *)(in_RDI + 0x6c));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"test_constructor",&local_1b9);
  local_1c0 = 0x62;
  (**(code **)(*in_RDI + 0x48))(in_RDI,pCVar2 == pCVar5,local_1b8,&local_1c0);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  pCVar3 = CEObservation::Observer(&local_170);
  pCVar6 = CEObservation::Observer((CEObservation *)(in_RDI + 0x6c));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"test_constructor",&local_1e1);
  local_1e8 = 99;
  (**(code **)(*in_RDI + 0x48))(in_RDI,pCVar3 == pCVar6,local_1e0,&local_1e8);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  CEObservation::CEObservation
            ((CEObservation *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
             in_stack_fffffffffffffb28,(CEBody *)in_stack_fffffffffffffb20,
             (CEDate *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18));
  pCVar1 = CEObservation::Body(&local_258);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"test_constructor",&local_279);
  local_280 = 0x67;
  (**(code **)(*in_RDI + 0x48))(in_RDI,pCVar1 == (CEBody *)(in_RDI + 0x44),local_278,&local_280);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  pCVar2 = CEObservation::Date(&local_258);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"test_constructor",&local_2a1);
  local_2a8 = 0x68;
  (**(code **)(*in_RDI + 0x48))(in_RDI,pCVar2 == (CEDate *)(in_RDI + 0x4e),local_2a0,&local_2a8);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  pCVar3 = CEObservation::Observer(&local_258);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c8,"test_constructor",&local_2c9);
  local_2d0 = 0x69;
  (**(code **)(*in_RDI + 0x48))(in_RDI,pCVar3 == (CEObserver *)(in_RDI + 0x56),local_2c8,&local_2d0)
  ;
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  CEObservation::CEObservation
            (in_stack_fffffffffffffb20,
             (CEObservation *)CONCAT17(in_stack_fffffffffffffb1f,in_stack_fffffffffffffb18));
  pCVar1 = CEObservation::Body(&local_340);
  bVar7 = pCVar1 == (CEBody *)(in_RDI + 0x44);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,"test_constructor",&local_361);
  local_368 = 0x6d;
  (**(code **)(*in_RDI + 0x48))(in_RDI,bVar7 & 1,local_360,&local_368);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  pCVar2 = CEObservation::Date(&local_340);
  bVar7 = pCVar2 == (CEDate *)(in_RDI + 0x4e);
  paVar9 = &local_389;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"test_constructor",paVar9);
  local_390 = 0x6e;
  (**(code **)(*in_RDI + 0x48))(in_RDI,bVar7 & 1,local_388,&local_390);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  pCVar3 = CEObservation::Observer(&local_340);
  bVar8 = pCVar3 == (CEObserver *)(in_RDI + 0x56);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"test_constructor",&local_3b1);
  local_3b8 = 0x6f;
  (**(code **)(*in_RDI + 0x48))(in_RDI,bVar8 & 1,local_3b0,&local_3b8);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  bVar7 = (**(code **)(*in_RDI + 0x18))();
  CEObservation::~CEObservation
            ((CEObservation *)CONCAT17(bVar8,CONCAT16(bVar7,in_stack_fffffffffffffb00)));
  CEObservation::~CEObservation
            ((CEObservation *)CONCAT17(bVar8,CONCAT16(bVar7,in_stack_fffffffffffffb00)));
  CEObservation::~CEObservation
            ((CEObservation *)CONCAT17(bVar8,CONCAT16(bVar7,in_stack_fffffffffffffb00)));
  CEObservation::~CEObservation
            ((CEObservation *)CONCAT17(bVar8,CONCAT16(bVar7,in_stack_fffffffffffffb00)));
  return (bool)(bVar7 & 1);
}

Assistant:

bool test_CEObservation::test_constructor(void)
{
    // Default constructor
    CEObservation test1;
    test(test1.Body() == nullptr, __func__, __LINE__);
    test(test1.Date() == nullptr, __func__, __LINE__);
    test(test1.Observer() == nullptr, __func__, __LINE__);

    // Test the copy constructor
    CEObservation test2(base_obs_);
    test(test2.Body() == base_obs_.Body(), __func__, __LINE__);
    test(test2.Date() == base_obs_.Date(), __func__, __LINE__);
    test(test2.Observer() == base_obs_.Observer(), __func__, __LINE__);

    // Test construction from base objects
    CEObservation test3(&base_observer_, &base_body_, &base_date_);
    test(test3.Body() == &base_body_, __func__, __LINE__);
    test(test3.Date() == &base_date_, __func__, __LINE__);
    test(test3.Observer() == &base_observer_, __func__, __LINE__);

    // Test the copy assignment operator
    CEObservation test4 = test3;
    test(test4.Body() == &base_body_, __func__, __LINE__);
    test(test4.Date() == &base_date_, __func__, __LINE__);
    test(test4.Observer() == &base_observer_, __func__, __LINE__);

    return pass();
}